

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_detail.c
# Opt level: O1

int main(void)

{
  uint insn;
  undefined *puVar1;
  uchar *buffer;
  uint64_t uVar2;
  cs_detail *pcVar3;
  cs_insn *pcVar4;
  size_t count;
  cs_err cVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  csh handle;
  cs_insn *all_insn;
  csh local_50;
  long local_48;
  cs_insn *local_40;
  size_t local_38;
  
  lVar8 = 0;
  do {
    puts("****************");
    puVar1 = (&PTR_anon_var_dwarf_45_00265068)[lVar8 * 5];
    local_48 = lVar8;
    printf("Platform: %s\n",puVar1);
    cVar5 = cs_open((&DAT_00265050)[lVar8 * 10],(&DAT_00265054)[lVar8 * 10],&local_50);
    if (cVar5 == CS_ERR_OK) {
      if ((&DAT_00265070)[lVar8 * 10] != 0) {
        cs_option(local_50,(&DAT_00265070)[lVar8 * 10],(ulong)(uint)(&DAT_00265074)[lVar8 * 10]);
      }
      cs_option(local_50,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00265058)[lVar8 * 5];
      sVar10 = (&DAT_00265060)[lVar8 * 5];
      local_38 = cs_disasm(local_50,buffer,sVar10,0x1000,0,&local_40);
      if (local_38 == 0) {
        puts("****************");
        printf("Platform: %s\n",puVar1);
        print_string_hex(buffer,sVar10);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        print_string_hex(buffer,sVar10);
        puts("Disasm:");
        sVar10 = 0;
        do {
          pcVar4 = local_40 + sVar10;
          uVar2 = local_40[sVar10].address;
          pcVar7 = local_40[sVar10].op_str;
          insn = ((cs_insn *)(pcVar7 + -0x42))->id;
          pcVar6 = cs_insn_name(local_50,insn);
          printf("0x%lx:\t%s\t\t%s // insn-ID: %u, insn-mnem: %s\n",uVar2,pcVar4->mnemonic,pcVar7,
                 (ulong)insn,pcVar6);
          pcVar3 = *(cs_detail **)(pcVar7 + 0xa6);
          if (pcVar3->regs_read_count != '\0') {
            printf("\tImplicit registers read: ");
            if (pcVar3->regs_read_count != '\0') {
              uVar9 = 0;
              do {
                pcVar7 = cs_reg_name(local_50,(uint)pcVar3->regs_read[uVar9]);
                printf("%s ",pcVar7);
                uVar9 = uVar9 + 1;
              } while (uVar9 < pcVar3->regs_read_count);
            }
            putchar(10);
          }
          if (pcVar3->regs_write_count != '\0') {
            printf("\tImplicit registers modified: ");
            if (pcVar3->regs_write_count != '\0') {
              uVar9 = 0;
              do {
                pcVar7 = cs_reg_name(local_50,(uint)pcVar3->regs_write[uVar9]);
                printf("%s ",pcVar7);
                uVar9 = uVar9 + 1;
              } while (uVar9 < pcVar3->regs_write_count);
            }
            putchar(10);
          }
          if (pcVar3->groups_count != '\0') {
            printf("\tThis instruction belongs to groups: ");
            if (pcVar3->groups_count != '\0') {
              uVar9 = 0;
              do {
                pcVar7 = cs_group_name(local_50,(uint)pcVar3->groups[uVar9]);
                printf("%s ",pcVar7);
                uVar9 = uVar9 + 1;
              } while (uVar9 < pcVar3->groups_count);
            }
            putchar(10);
          }
          count = local_38;
          sVar10 = sVar10 + 1;
        } while (sVar10 != local_38);
        printf("0x%lx:\n",(ulong)local_40[local_38 - 1].size + local_40[local_38 - 1].address);
        cs_free(local_40,count);
      }
      lVar8 = local_48;
      putchar(10);
      cs_close(&local_50);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar5);
      lVar8 = local_48;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x14);
  return 0;
}

Assistant:

int main()
{
	test();

	return 0;
}